

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulateutil.cc
# Opt level: O2

void __thiscall EmulateSnippet::executeBranchind(EmulateSnippet *this)

{
  LowlevelError *this_00;
  char *pcVar1;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  pcVar1 = get_opname(this->currentOp->behave->opcode);
  std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
  std::operator+(&local_38,"Illegal p-code operation in snippet: ",&local_58);
  LowlevelError::LowlevelError(this_00,&local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmulateSnippet::executeBranchind(void)

{
  throw LowlevelError("Illegal p-code operation in snippet: "+ (string)get_opname(currentOp->getOpcode()));
}